

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

int WebPIoInitFromOptions(WebPDecoderOptions *options,VP8Io *io,WEBP_CSP_MODE src_colorspace)

{
  int iVar1;
  WEBP_CSP_MODE in_EDX;
  int *in_RSI;
  int *in_RDI;
  int scaled_height;
  int scaled_width;
  int h;
  int w;
  int y;
  int x;
  int H;
  int W;
  bool local_41;
  byte local_40;
  bool local_3f;
  bool local_3e;
  bool local_3d;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  uint local_2c;
  uint local_28;
  int local_24;
  int local_20;
  int *local_18;
  int *local_10;
  
  local_20 = *in_RSI;
  local_24 = in_RSI[1];
  local_28 = 0;
  local_2c = 0;
  local_3d = false;
  if (in_RDI != (int *)0x0) {
    local_3d = in_RDI[2] != 0;
  }
  in_RSI[0x1d] = (uint)local_3d;
  local_34 = local_24;
  local_30 = local_20;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RSI[0x1d] != 0) {
    local_30 = in_RDI[5];
    local_34 = in_RDI[6];
    local_28 = in_RDI[3];
    local_2c = in_RDI[4];
    iVar1 = WebPIsRGBMode(in_EDX);
    if (iVar1 == 0) {
      local_28 = local_28 & 0xfffffffe;
      local_2c = local_2c & 0xfffffffe;
    }
    iVar1 = WebPCheckCropDimensions(local_20,local_24,local_28,local_2c,local_30,local_34);
    if (iVar1 == 0) {
      return 0;
    }
  }
  local_18[0x1e] = local_28;
  local_18[0x20] = local_2c;
  local_18[0x1f] = local_28 + local_30;
  local_18[0x21] = local_2c + local_34;
  local_18[3] = local_30;
  local_18[4] = local_34;
  local_3e = false;
  if (local_10 != (int *)0x0) {
    local_3e = local_10[7] != 0;
  }
  local_18[0x22] = (uint)local_3e;
  if (local_18[0x22] != 0) {
    local_38 = local_10[8];
    local_3c = local_10[9];
    iVar1 = WebPRescalerGetScaledDimensions(local_30,local_34,&local_38,&local_3c);
    if (iVar1 == 0) {
      return 0;
    }
    local_18[0x23] = local_38;
    local_18[0x24] = local_3c;
  }
  local_3f = false;
  if (local_10 != (int *)0x0) {
    local_3f = *local_10 != 0;
  }
  local_18[0x1c] = (uint)local_3f;
  local_40 = 1;
  if (local_10 != (int *)0x0) {
    local_40 = local_10[1] != 0 ^ 0xff;
  }
  local_18[0x16] = (uint)(local_40 & 1);
  if (local_18[0x22] != 0) {
    local_41 = false;
    if (local_18[0x23] < (local_20 * 3) / 4) {
      local_41 = local_18[0x24] < (local_24 * 3) / 4;
    }
    local_18[0x1c] = (uint)local_41 | local_18[0x1c];
    local_18[0x16] = 0;
  }
  return 1;
}

Assistant:

int WebPIoInitFromOptions(const WebPDecoderOptions* const options,
                          VP8Io* const io, WEBP_CSP_MODE src_colorspace) {
  const int W = io->width;
  const int H = io->height;
  int x = 0, y = 0, w = W, h = H;

  // Cropping
  io->use_cropping = (options != NULL) && options->use_cropping;
  if (io->use_cropping) {
    w = options->crop_width;
    h = options->crop_height;
    x = options->crop_left;
    y = options->crop_top;
    if (!WebPIsRGBMode(src_colorspace)) {   // only snap for YUV420
      x &= ~1;
      y &= ~1;
    }
    if (!WebPCheckCropDimensions(W, H, x, y, w, h)) {
      return 0;  // out of frame boundary error
    }
  }
  io->crop_left   = x;
  io->crop_top    = y;
  io->crop_right  = x + w;
  io->crop_bottom = y + h;
  io->mb_w = w;
  io->mb_h = h;

  // Scaling
  io->use_scaling = (options != NULL) && options->use_scaling;
  if (io->use_scaling) {
    int scaled_width = options->scaled_width;
    int scaled_height = options->scaled_height;
    if (!WebPRescalerGetScaledDimensions(w, h, &scaled_width, &scaled_height)) {
      return 0;
    }
    io->scaled_width = scaled_width;
    io->scaled_height = scaled_height;
  }

  // Filter
  io->bypass_filtering = (options != NULL) && options->bypass_filtering;

  // Fancy upsampler
#ifdef FANCY_UPSAMPLING
  io->fancy_upsampling = (options == NULL) || (!options->no_fancy_upsampling);
#endif

  if (io->use_scaling) {
    // disable filter (only for large downscaling ratio).
    io->bypass_filtering |= (io->scaled_width < W * 3 / 4) &&
                            (io->scaled_height < H * 3 / 4);
    io->fancy_upsampling = 0;
  }
  return 1;
}